

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_sei.c
# Opt level: O1

void write_sei_payload(h264_stream_t *h,bs_t *b)

{
  int *piVar1;
  uint8_t **ppuVar2;
  ulong uVar3;
  _Bool _Var4;
  byte bVar5;
  ushort uVar6;
  sei_scalability_info_t *psVar7;
  sei_t *psVar8;
  byte *pbVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint8_t **ppuVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  
  psVar8 = h->sei;
  if (psVar8->payloadType == 0x18) {
    psVar7 = (h->sei->field_2).sei_svc;
    _Var4 = psVar7->temporal_id_nesting_flag;
    piVar1 = &b->bits_left;
    iVar10 = b->bits_left + -1;
    b->bits_left = iVar10;
    ppuVar2 = &b->p;
    pbVar9 = b->p;
    if (pbVar9 < b->end) {
      *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)iVar10 & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
    }
    ppuVar14 = &b->end;
    if (*piVar1 == 0) {
      *ppuVar2 = *ppuVar2 + 1;
      *piVar1 = 8;
    }
    _Var4 = psVar7->priority_layer_info_present_flag;
    iVar10 = *piVar1;
    *piVar1 = iVar10 + -1;
    pbVar9 = *ppuVar2;
    if (pbVar9 < *ppuVar14) {
      *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
    }
    if (*piVar1 == 0) {
      *ppuVar2 = *ppuVar2 + 1;
      *piVar1 = 8;
    }
    _Var4 = psVar7->priority_id_setting_flag;
    iVar10 = *piVar1;
    *piVar1 = iVar10 + -1;
    pbVar9 = *ppuVar2;
    if (pbVar9 < *ppuVar14) {
      *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
      **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
    }
    if (*piVar1 == 0) {
      *ppuVar2 = *ppuVar2 + 1;
      *piVar1 = 8;
    }
    uVar6 = psVar7->num_layers_minus1;
    if (uVar6 == 0) {
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
    }
    else {
      uVar16 = (ulong)uVar6 + 1;
      if ((ulong)uVar6 == 0xffff) {
        iVar10 = 0x11;
      }
      else if (uVar6 < 0xff) {
        iVar10 = *(int *)(bs_write_ue_len_table + uVar16 * 4);
      }
      else {
        iVar10 = *(int *)(bs_write_ue_len_table + (uVar16 >> 8) * 4) + 8;
      }
      if (0 < iVar10) {
        uVar15 = iVar10 * 2 - 2;
        do {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 |
                        (((uint)uVar16 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
      }
    }
    uVar16 = 0;
    do {
      uVar6 = psVar7->layers[uVar16].layer_id;
      if (uVar6 == 0) {
        iVar10 = *piVar1;
        *piVar1 = iVar10 + -1;
        pbVar9 = *ppuVar2;
        if (pbVar9 < *ppuVar14) {
          *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
        }
        if (*piVar1 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      else {
        uVar12 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          iVar10 = 0x11;
        }
        else if (uVar6 < 0xff) {
          iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
        }
        else {
          iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
        }
        if (0 < iVar10) {
          uVar15 = iVar10 * 2 - 2;
          do {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
            bVar17 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar17);
        }
      }
      bVar5 = psVar7->layers[uVar16].priority_id;
      uVar15 = 5;
      do {
        iVar10 = *piVar1;
        *piVar1 = iVar10 + -1;
        pbVar9 = *ppuVar2;
        if (pbVar9 < *ppuVar14) {
          *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
          **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        }
        if (*piVar1 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
        bVar17 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar17);
      _Var4 = psVar7->layers[uVar16].discardable_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      bVar5 = psVar7->layers[uVar16].dependency_id;
      uVar15 = 2;
      do {
        iVar10 = *piVar1;
        *piVar1 = iVar10 + -1;
        pbVar9 = *ppuVar2;
        if (pbVar9 < *ppuVar14) {
          *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
          **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        }
        if (*piVar1 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
        bVar17 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar17);
      bVar5 = psVar7->layers[uVar16].quality_id;
      uVar15 = 3;
      do {
        iVar10 = *piVar1;
        *piVar1 = iVar10 + -1;
        pbVar9 = *ppuVar2;
        if (pbVar9 < *ppuVar14) {
          *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
          **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        }
        if (*piVar1 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
        bVar17 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar17);
      bVar5 = psVar7->layers[uVar16].temporal_id;
      uVar15 = 2;
      do {
        iVar10 = *piVar1;
        *piVar1 = iVar10 + -1;
        pbVar9 = *ppuVar2;
        if (pbVar9 < *ppuVar14) {
          *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
          **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
        }
        if (*piVar1 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
        bVar17 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar17);
      _Var4 = psVar7->layers[uVar16].sub_pic_layer_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].sub_region_layer_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].iroi_division_info_present_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].profile_level_info_present_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].bitrate_info_present_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].frm_rate_info_present_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].frm_size_info_present_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].layer_dependency_info_present_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].parameter_sets_info_present_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].bitstream_restriction_info_present_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].exact_inter_layer_pred_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      if ((psVar7->layers[uVar16].sub_pic_layer_flag != false) ||
         (psVar7->layers[uVar16].iroi_division_info_present_flag == true)) {
        _Var4 = psVar7->layers[uVar16].exact_sample_value_match_flag;
        iVar10 = *piVar1;
        *piVar1 = iVar10 + -1;
        pbVar9 = *ppuVar2;
        if (pbVar9 < *ppuVar14) {
          *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
          **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
        }
        if (*piVar1 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      _Var4 = psVar7->layers[uVar16].layer_conversion_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      _Var4 = psVar7->layers[uVar16].layer_output_flag;
      iVar10 = *piVar1;
      *piVar1 = iVar10 + -1;
      pbVar9 = *ppuVar2;
      if (pbVar9 < *ppuVar14) {
        *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
        **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
      }
      if (*piVar1 == 0) {
        *ppuVar2 = *ppuVar2 + 1;
        *piVar1 = 8;
      }
      if (psVar7->layers[uVar16].profile_level_info_present_flag == true) {
        uVar15 = psVar7->layers[uVar16].layer_profile_level_idc;
        uVar13 = 0x17;
        do {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | ((uVar15 >> (uVar13 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f)
            ;
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
          bVar17 = uVar13 != 0;
          uVar13 = uVar13 - 1;
        } while (bVar17);
      }
      if (psVar7->layers[uVar16].bitrate_info_present_flag == true) {
        uVar6 = psVar7->layers[uVar16].avg_bitrate;
        uVar15 = 0xf;
        do {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
        uVar6 = psVar7->layers[uVar16].max_bitrate_layer;
        uVar15 = 0xf;
        do {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
        uVar6 = psVar7->layers[uVar16].max_bitrate_layer_representation;
        uVar15 = 0xf;
        do {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
        uVar6 = psVar7->layers[uVar16].max_bitrate_calc_window;
        uVar15 = 0xf;
        do {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
      }
      if (psVar7->layers[uVar16].frm_rate_info_present_flag == true) {
        bVar5 = psVar7->layers[uVar16].constant_frm_rate_idc;
        uVar15 = 1;
        do {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
        uVar6 = psVar7->layers[uVar16].avg_frm_rate;
        uVar15 = 0xf;
        do {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
      }
      if ((psVar7->layers[uVar16].frm_size_info_present_flag != false) ||
         (psVar7->layers[uVar16].iroi_division_info_present_flag == true)) {
        uVar6 = psVar7->layers[uVar16].frm_width_in_mbs_minus1;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        uVar6 = psVar7->layers[uVar16].frm_height_in_mbs_minus1;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
      }
      if (psVar7->layers[uVar16].sub_region_layer_flag == true) {
        uVar6 = psVar7->layers[uVar16].base_region_layer_id;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        _Var4 = psVar7->layers[uVar16].dynamic_rect_flag;
        iVar10 = *piVar1;
        *piVar1 = iVar10 + -1;
        pbVar9 = *ppuVar2;
        if (pbVar9 < *ppuVar14) {
          *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
          **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
        }
        if (*piVar1 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
        if (psVar7->layers[uVar16].dynamic_rect_flag == true) {
          uVar6 = psVar7->layers[uVar16].horizontal_offset;
          uVar15 = 0xf;
          do {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
            bVar17 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar17);
          uVar6 = psVar7->layers[uVar16].vertical_offset;
          uVar15 = 0xf;
          do {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
            bVar17 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar17);
          uVar6 = psVar7->layers[uVar16].region_width;
          uVar15 = 0xf;
          do {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
            bVar17 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar17);
          uVar6 = psVar7->layers[uVar16].region_height;
          uVar15 = 0xf;
          do {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
            bVar17 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar17);
        }
      }
      if (psVar7->layers[uVar16].sub_pic_layer_flag == true) {
        uVar6 = psVar7->layers[uVar16].roi_id;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
      }
      if (psVar7->layers[uVar16].iroi_division_info_present_flag == true) {
        _Var4 = psVar7->layers[uVar16].iroi_grid_flag;
        iVar10 = *piVar1;
        *piVar1 = iVar10 + -1;
        pbVar9 = *ppuVar2;
        if (pbVar9 < *ppuVar14) {
          *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
          **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
        }
        if (*piVar1 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
        if (psVar7->layers[uVar16].iroi_grid_flag == true) {
          uVar6 = psVar7->layers[uVar16].grid_width_in_mbs_minus1;
          if (uVar6 == 0) {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
          }
          else {
            uVar12 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              iVar10 = 0x11;
            }
            else if (uVar6 < 0xff) {
              iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
            }
            else {
              iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
            }
            if (0 < iVar10) {
              uVar15 = iVar10 * 2 - 2;
              do {
                iVar10 = *piVar1;
                *piVar1 = iVar10 + -1;
                pbVar9 = *ppuVar2;
                if (pbVar9 < *ppuVar14) {
                  *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                  **ppuVar2 = **ppuVar2 |
                              (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f)
                  ;
                }
                if (*piVar1 == 0) {
                  *ppuVar2 = *ppuVar2 + 1;
                  *piVar1 = 8;
                }
                bVar17 = uVar15 != 0;
                uVar15 = uVar15 - 1;
              } while (bVar17);
            }
          }
          uVar6 = psVar7->layers[uVar16].grid_height_in_mbs_minus1;
          if (uVar6 == 0) {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
          }
          else {
            uVar12 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              iVar10 = 0x11;
            }
            else if (uVar6 < 0xff) {
              iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
            }
            else {
              iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
            }
            if (0 < iVar10) {
              uVar15 = iVar10 * 2 - 2;
              do {
                iVar10 = *piVar1;
                *piVar1 = iVar10 + -1;
                pbVar9 = *ppuVar2;
                if (pbVar9 < *ppuVar14) {
                  *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                  **ppuVar2 = **ppuVar2 |
                              (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f)
                  ;
                }
                if (*piVar1 == 0) {
                  *ppuVar2 = *ppuVar2 + 1;
                  *piVar1 = 8;
                }
                bVar17 = uVar15 != 0;
                uVar15 = uVar15 - 1;
              } while (bVar17);
            }
          }
        }
        else {
          uVar6 = psVar7->layers[uVar16].num_rois_minus1;
          if (uVar6 == 0) {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
          }
          else {
            uVar12 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              iVar10 = 0x11;
            }
            else if (uVar6 < 0xff) {
              iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
            }
            else {
              iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
            }
            if (0 < iVar10) {
              uVar15 = iVar10 * 2 - 2;
              do {
                iVar10 = *piVar1;
                *piVar1 = iVar10 + -1;
                pbVar9 = *ppuVar2;
                if (pbVar9 < *ppuVar14) {
                  *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                  **ppuVar2 = **ppuVar2 |
                              (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f)
                  ;
                }
                if (*piVar1 == 0) {
                  *ppuVar2 = *ppuVar2 + 1;
                  *piVar1 = 8;
                }
                bVar17 = uVar15 != 0;
                uVar15 = uVar15 - 1;
              } while (bVar17);
            }
          }
          uVar12 = 0;
          do {
            uVar6 = psVar7->layers[uVar16].roi[uVar12].first_mb_in_roi;
            if (uVar6 == 0) {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
            }
            else {
              uVar3 = (ulong)uVar6 + 1;
              if ((ulong)uVar6 == 0xffff) {
                iVar10 = 0x11;
              }
              else if (uVar6 < 0xff) {
                iVar10 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar10 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (0 < iVar10) {
                uVar15 = iVar10 * 2 - 2;
                do {
                  iVar10 = *piVar1;
                  *piVar1 = iVar10 + -1;
                  pbVar9 = *ppuVar2;
                  if (pbVar9 < *ppuVar14) {
                    *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                    **ppuVar2 = **ppuVar2 |
                                (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) <<
                                ((byte)*piVar1 & 0x1f);
                  }
                  if (*piVar1 == 0) {
                    *ppuVar2 = *ppuVar2 + 1;
                    *piVar1 = 8;
                  }
                  bVar17 = uVar15 != 0;
                  uVar15 = uVar15 - 1;
                } while (bVar17);
              }
            }
            uVar6 = psVar7->layers[uVar16].roi[uVar12].roi_width_in_mbs_minus1;
            if (uVar6 == 0) {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
            }
            else {
              uVar3 = (ulong)uVar6 + 1;
              if ((ulong)uVar6 == 0xffff) {
                iVar10 = 0x11;
              }
              else if (uVar6 < 0xff) {
                iVar10 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar10 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (0 < iVar10) {
                uVar15 = iVar10 * 2 - 2;
                do {
                  iVar10 = *piVar1;
                  *piVar1 = iVar10 + -1;
                  pbVar9 = *ppuVar2;
                  if (pbVar9 < *ppuVar14) {
                    *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                    **ppuVar2 = **ppuVar2 |
                                (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) <<
                                ((byte)*piVar1 & 0x1f);
                  }
                  if (*piVar1 == 0) {
                    *ppuVar2 = *ppuVar2 + 1;
                    *piVar1 = 8;
                  }
                  bVar17 = uVar15 != 0;
                  uVar15 = uVar15 - 1;
                } while (bVar17);
              }
            }
            uVar6 = psVar7->layers[uVar16].roi[uVar12].roi_height_in_mbs_minus1;
            if (uVar6 == 0) {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
            }
            else {
              uVar3 = (ulong)uVar6 + 1;
              if ((ulong)uVar6 == 0xffff) {
                iVar10 = 0x11;
              }
              else if (uVar6 < 0xff) {
                iVar10 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar10 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (0 < iVar10) {
                uVar15 = iVar10 * 2 - 2;
                do {
                  iVar10 = *piVar1;
                  *piVar1 = iVar10 + -1;
                  pbVar9 = *ppuVar2;
                  if (pbVar9 < *ppuVar14) {
                    *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                    **ppuVar2 = **ppuVar2 |
                                (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) <<
                                ((byte)*piVar1 & 0x1f);
                  }
                  if (*piVar1 == 0) {
                    *ppuVar2 = *ppuVar2 + 1;
                    *piVar1 = 8;
                  }
                  bVar17 = uVar15 != 0;
                  uVar15 = uVar15 - 1;
                } while (bVar17);
              }
            }
            bVar17 = uVar12 < psVar7->layers[uVar16].num_rois_minus1;
            uVar12 = uVar12 + 1;
          } while (bVar17);
        }
      }
      if (psVar7->layers[uVar16].layer_dependency_info_present_flag == true) {
        uVar6 = psVar7->layers[uVar16].num_directly_dependent_layers;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        if (psVar7->layers[uVar16].num_directly_dependent_layers != 0) {
          uVar12 = 0;
          do {
            uVar6 = psVar7->layers[uVar16].directly_dependent_layer_id_delta_minus1[uVar12];
            if (uVar6 == 0) {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
            }
            else {
              uVar3 = (ulong)uVar6 + 1;
              if ((ulong)uVar6 == 0xffff) {
                iVar10 = 0x11;
              }
              else if (uVar6 < 0xff) {
                iVar10 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar10 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (0 < iVar10) {
                uVar15 = iVar10 * 2 - 2;
                do {
                  iVar10 = *piVar1;
                  *piVar1 = iVar10 + -1;
                  pbVar9 = *ppuVar2;
                  if (pbVar9 < *ppuVar14) {
                    *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                    **ppuVar2 = **ppuVar2 |
                                (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) <<
                                ((byte)*piVar1 & 0x1f);
                  }
                  if (*piVar1 == 0) {
                    *ppuVar2 = *ppuVar2 + 1;
                    *piVar1 = 8;
                  }
                  bVar17 = uVar15 != 0;
                  uVar15 = uVar15 - 1;
                } while (bVar17);
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < psVar7->layers[uVar16].num_directly_dependent_layers);
        }
      }
      else {
        uVar6 = psVar7->layers[uVar16].layer_dependency_info_src_layer_id_delta;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
      }
      if (psVar7->layers[uVar16].parameter_sets_info_present_flag == true) {
        uVar6 = psVar7->layers[uVar16].num_seq_parameter_sets;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        if (psVar7->layers[uVar16].num_seq_parameter_sets != 0) {
          uVar12 = 0;
          do {
            uVar6 = psVar7->layers[uVar16].seq_parameter_set_id_delta[uVar12];
            if (uVar6 == 0) {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
            }
            else {
              uVar3 = (ulong)uVar6 + 1;
              if ((ulong)uVar6 == 0xffff) {
                iVar10 = 0x11;
              }
              else if (uVar6 < 0xff) {
                iVar10 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar10 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (0 < iVar10) {
                uVar15 = iVar10 * 2 - 2;
                do {
                  iVar10 = *piVar1;
                  *piVar1 = iVar10 + -1;
                  pbVar9 = *ppuVar2;
                  if (pbVar9 < *ppuVar14) {
                    *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                    **ppuVar2 = **ppuVar2 |
                                (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) <<
                                ((byte)*piVar1 & 0x1f);
                  }
                  if (*piVar1 == 0) {
                    *ppuVar2 = *ppuVar2 + 1;
                    *piVar1 = 8;
                  }
                  bVar17 = uVar15 != 0;
                  uVar15 = uVar15 - 1;
                } while (bVar17);
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < psVar7->layers[uVar16].num_seq_parameter_sets);
        }
        uVar6 = psVar7->layers[uVar16].num_subset_seq_parameter_sets;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        if (psVar7->layers[uVar16].num_subset_seq_parameter_sets != 0) {
          uVar12 = 0;
          do {
            uVar6 = psVar7->layers[uVar16].subset_seq_parameter_set_id_delta[uVar12];
            if (uVar6 == 0) {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
            }
            else {
              uVar3 = (ulong)uVar6 + 1;
              if ((ulong)uVar6 == 0xffff) {
                iVar10 = 0x11;
              }
              else if (uVar6 < 0xff) {
                iVar10 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar10 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (0 < iVar10) {
                uVar15 = iVar10 * 2 - 2;
                do {
                  iVar10 = *piVar1;
                  *piVar1 = iVar10 + -1;
                  pbVar9 = *ppuVar2;
                  if (pbVar9 < *ppuVar14) {
                    *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                    **ppuVar2 = **ppuVar2 |
                                (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) <<
                                ((byte)*piVar1 & 0x1f);
                  }
                  if (*piVar1 == 0) {
                    *ppuVar2 = *ppuVar2 + 1;
                    *piVar1 = 8;
                  }
                  bVar17 = uVar15 != 0;
                  uVar15 = uVar15 - 1;
                } while (bVar17);
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < psVar7->layers[uVar16].num_subset_seq_parameter_sets);
        }
        uVar6 = psVar7->layers[uVar16].num_pic_parameter_sets_minus1;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        if (psVar7->layers[uVar16].num_pic_parameter_sets_minus1 != 0) {
          uVar12 = 0;
          do {
            uVar6 = psVar7->layers[uVar16].pic_parameter_set_id_delta[uVar12];
            if (uVar6 == 0) {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
            }
            else {
              uVar3 = (ulong)uVar6 + 1;
              if ((ulong)uVar6 == 0xffff) {
                iVar10 = 0x11;
              }
              else if (uVar6 < 0xff) {
                iVar10 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
              }
              else {
                iVar10 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
              }
              if (0 < iVar10) {
                uVar15 = iVar10 * 2 - 2;
                do {
                  iVar10 = *piVar1;
                  *piVar1 = iVar10 + -1;
                  pbVar9 = *ppuVar2;
                  if (pbVar9 < *ppuVar14) {
                    *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                    **ppuVar2 = **ppuVar2 |
                                (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) <<
                                ((byte)*piVar1 & 0x1f);
                  }
                  if (*piVar1 == 0) {
                    *ppuVar2 = *ppuVar2 + 1;
                    *piVar1 = 8;
                  }
                  bVar17 = uVar15 != 0;
                  uVar15 = uVar15 - 1;
                } while (bVar17);
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < psVar7->layers[uVar16].num_pic_parameter_sets_minus1);
        }
      }
      else {
        uVar6 = psVar7->layers[uVar16].parameter_sets_info_src_layer_id_delta;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
      }
      if (psVar7->layers[uVar16].bitstream_restriction_info_present_flag == true) {
        _Var4 = psVar7->layers[uVar16].motion_vectors_over_pic_boundaries_flag;
        iVar10 = *piVar1;
        *piVar1 = iVar10 + -1;
        pbVar9 = *ppuVar2;
        if (pbVar9 < *ppuVar14) {
          *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
          **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
        }
        if (*piVar1 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
        uVar6 = psVar7->layers[uVar16].max_bytes_per_pic_denom;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        uVar6 = psVar7->layers[uVar16].max_bits_per_mb_denom;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        uVar6 = psVar7->layers[uVar16].log2_max_mv_length_horizontal;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        uVar6 = psVar7->layers[uVar16].log2_max_mv_length_vertical;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        uVar6 = psVar7->layers[uVar16].max_num_reorder_frames;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        uVar6 = psVar7->layers[uVar16].max_dec_frame_buffering;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
      }
      if (psVar7->layers[uVar16].layer_conversion_flag == true) {
        uVar6 = psVar7->layers[uVar16].conversion_type_idc;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        lVar11 = 0;
        do {
          _Var4 = psVar7->layers[uVar16].rewriting_info_flag[lVar11];
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | _Var4 << ((byte)*piVar1 & 0x1f);
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
          if (psVar7->layers[uVar16].rewriting_info_flag[lVar11] == true) {
            uVar15 = psVar7->layers[uVar16].rewriting_profile_level_idc[lVar11];
            uVar13 = 0x17;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            ((uVar15 >> (uVar13 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar13 != 0;
              uVar13 = uVar13 - 1;
            } while (bVar17);
            uVar6 = psVar7->layers[uVar16].rewriting_avg_bitrate[lVar11];
            uVar15 = 0xf;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
            uVar6 = psVar7->layers[uVar16].rewriting_max_bitrate[lVar11];
            uVar15 = 0xf;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
          bVar17 = lVar11 == 0;
          lVar11 = lVar11 + 1;
        } while (bVar17);
      }
      bVar17 = uVar16 < psVar7->num_layers_minus1;
      uVar16 = uVar16 + 1;
    } while (bVar17);
    if (psVar7->priority_layer_info_present_flag != false) {
      uVar6 = psVar7->pr_num_dIds_minus1;
      if (uVar6 == 0) {
        iVar10 = *piVar1;
        *piVar1 = iVar10 + -1;
        pbVar9 = *ppuVar2;
        if (pbVar9 < *ppuVar14) {
          *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
          **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
        }
        if (*piVar1 == 0) {
          *ppuVar2 = *ppuVar2 + 1;
          *piVar1 = 8;
        }
      }
      else {
        uVar16 = (ulong)uVar6 + 1;
        if ((ulong)uVar6 == 0xffff) {
          iVar10 = 0x11;
        }
        else if (uVar6 < 0xff) {
          iVar10 = *(int *)(bs_write_ue_len_table + uVar16 * 4);
        }
        else {
          iVar10 = *(int *)(bs_write_ue_len_table + (uVar16 >> 8) * 4) + 8;
        }
        if (0 < iVar10) {
          uVar15 = iVar10 * 2 - 2;
          do {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          (((uint)uVar16 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
            bVar17 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar17);
        }
      }
      uVar16 = 0;
      do {
        bVar5 = psVar7->pr[uVar16].pr_dependency_id;
        uVar15 = 2;
        do {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
        uVar6 = psVar7->pr[uVar16].pr_num_minus1;
        if (uVar6 == 0) {
          iVar10 = *piVar1;
          *piVar1 = iVar10 + -1;
          pbVar9 = *ppuVar2;
          if (pbVar9 < *ppuVar14) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
            **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
          }
          if (*piVar1 == 0) {
            *ppuVar2 = *ppuVar2 + 1;
            *piVar1 = 8;
          }
        }
        else {
          uVar12 = (ulong)uVar6 + 1;
          if ((ulong)uVar6 == 0xffff) {
            iVar10 = 0x11;
          }
          else if (uVar6 < 0xff) {
            iVar10 = *(int *)(bs_write_ue_len_table + uVar12 * 4);
          }
          else {
            iVar10 = *(int *)(bs_write_ue_len_table + (uVar12 >> 8) * 4) + 8;
          }
          if (0 < iVar10) {
            uVar15 = iVar10 * 2 - 2;
            do {
              iVar10 = *piVar1;
              *piVar1 = iVar10 + -1;
              pbVar9 = *ppuVar2;
              if (pbVar9 < *ppuVar14) {
                *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                **ppuVar2 = **ppuVar2 |
                            (((uint)uVar12 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
              }
              if (*piVar1 == 0) {
                *ppuVar2 = *ppuVar2 + 1;
                *piVar1 = 8;
              }
              bVar17 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar17);
          }
        }
        uVar12 = 0;
        do {
          uVar6 = psVar7->pr[uVar16].pr_info[uVar12].pr_id;
          if (uVar6 == 0) {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 | (byte)(1 << ((byte)*piVar1 & 0x1f));
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
          }
          else {
            uVar3 = (ulong)uVar6 + 1;
            if ((ulong)uVar6 == 0xffff) {
              iVar10 = 0x11;
            }
            else if (uVar6 < 0xff) {
              iVar10 = *(int *)(bs_write_ue_len_table + uVar3 * 4);
            }
            else {
              iVar10 = *(int *)(bs_write_ue_len_table + (uVar3 >> 8) * 4) + 8;
            }
            if (0 < iVar10) {
              uVar15 = iVar10 * 2 - 2;
              do {
                iVar10 = *piVar1;
                *piVar1 = iVar10 + -1;
                pbVar9 = *ppuVar2;
                if (pbVar9 < *ppuVar14) {
                  *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
                  **ppuVar2 = **ppuVar2 |
                              (((uint)uVar3 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
                }
                if (*piVar1 == 0) {
                  *ppuVar2 = *ppuVar2 + 1;
                  *piVar1 = 8;
                }
                bVar17 = uVar15 != 0;
                uVar15 = uVar15 - 1;
              } while (bVar17);
            }
          }
          uVar15 = psVar7->pr[uVar16].pr_info[uVar12].pr_profile_level_idc;
          uVar13 = 0x17;
          do {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          ((uVar15 >> (uVar13 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
            bVar17 = uVar13 != 0;
            uVar13 = uVar13 - 1;
          } while (bVar17);
          uVar6 = psVar7->pr[uVar16].pr_info[uVar12].pr_avg_bitrate;
          uVar15 = 0xf;
          do {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
            bVar17 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar17);
          uVar6 = psVar7->pr[uVar16].pr_info[uVar12].pr_max_bitrate;
          uVar15 = 0xf;
          do {
            iVar10 = *piVar1;
            *piVar1 = iVar10 + -1;
            pbVar9 = *ppuVar2;
            if (pbVar9 < *ppuVar14) {
              *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)(iVar10 + -1) & 0x1f));
              **ppuVar2 = **ppuVar2 |
                          ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)*piVar1 & 0x1f);
            }
            if (*piVar1 == 0) {
              *ppuVar2 = *ppuVar2 + 1;
              *piVar1 = 8;
            }
            bVar17 = uVar15 != 0;
            uVar15 = uVar15 - 1;
          } while (bVar17);
          bVar17 = uVar12 < psVar7->pr[uVar16].pr_num_minus1;
          uVar12 = uVar12 + 1;
        } while (bVar17);
        bVar17 = uVar16 < psVar7->pr_num_dIds_minus1;
        uVar16 = uVar16 + 1;
      } while (bVar17);
    }
    return;
  }
  if (0 < psVar8->payloadSize) {
    lVar11 = 0;
    do {
      bVar5 = *(byte *)((long)((psVar8->field_2).sei_svc)->layers[0].roi + lVar11 + -0x4a);
      if ((b->bits_left == 8) && (b->p < b->end)) {
        *b->p = bVar5;
        b->p = b->p + 1;
      }
      else {
        uVar15 = 7;
        do {
          iVar10 = b->bits_left + -1;
          b->bits_left = iVar10;
          pbVar9 = b->p;
          if (pbVar9 < b->end) {
            *pbVar9 = *pbVar9 & ~(byte)(1 << ((byte)iVar10 & 0x1f));
            *b->p = *b->p | ((bVar5 >> (uVar15 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
          }
          if (b->bits_left == 0) {
            b->p = b->p + 1;
            b->bits_left = 8;
          }
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < psVar8->payloadSize);
  }
  return;
}

Assistant:

void write_sei_payload( h264_stream_t* h, bs_t* b )
{
    sei_t* s = h->sei;
    
    int i;
    switch( s->payloadType )
    {
        case SEI_TYPE_SCALABILITY_INFO:
            if( 0 )
            {
                s->sei_svc = (sei_scalability_info_t*)calloc( 1, sizeof(sei_scalability_info_t) );
            }
            write_sei_scalability_info( h, b );
            break;
        default:
            if( 0 )
            {
                s->data = (uint8_t*)calloc(1, s->payloadSize);
            }
            
            for ( i = 0; i < s->payloadSize; i++ )
                bs_write_u8(b, s->data[i]);
    }
    
    //if( 0 )
    //    read_sei_end_bits(h, b);
}